

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

BytesToSend * __thiscall
V2Transport::GetBytesToSend_abi_cxx11_
          (BytesToSend *__return_storage_ptr__,V2Transport *this,bool have_next_message)

{
  SendState SVar1;
  pointer puVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock51;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_send_mutex).super_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  SVar1 = this->m_send_state;
  if (SVar1 == V1) {
    V1Transport::GetBytesToSend_abi_cxx11_
              (__return_storage_ptr__,&this->m_v1_fallback,have_next_message);
  }
  else {
    puVar2 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_send_pos;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).
    super__Tuple_impl<1UL,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .
    super__Tuple_impl<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .
    super__Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
    ._M_head_impl = &this->m_send_type;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).
    super__Tuple_impl<1UL,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .super__Head_base<1UL,_bool,_false>._M_head_impl = SVar1 == READY && have_next_message;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).super__Head_base<0UL,_Span<const_unsigned_char>,_false>._M_head_impl.m_data = puVar3;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).super__Head_base<0UL,_Span<const_unsigned_char>,_false>._M_head_impl.m_size =
         (long)puVar2 - (long)puVar3;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Transport::BytesToSend V2Transport::GetBytesToSend(bool have_next_message) const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.GetBytesToSend(have_next_message);

    if (m_send_state == SendState::MAYBE_V1) Assume(m_send_buffer.empty());
    Assume(m_send_pos <= m_send_buffer.size());
    return {
        Span{m_send_buffer}.subspan(m_send_pos),
        // We only have more to send after the current m_send_buffer if there is a (next)
        // message to be sent, and we're capable of sending packets. */
        have_next_message && m_send_state == SendState::READY,
        m_send_type
    };
}